

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raster.cpp
# Opt level: O2

void rw::copyPal8(uint8 *dst,uint32 dststride,uint8 *src,uint32 srcstride,int32 w,int32 h)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  uint uVar5;
  int iVar6;
  ulong uVar7;
  
  uVar2 = 0;
  uVar4 = (ulong)(uint)w;
  if (w < 1) {
    uVar4 = 0;
  }
  if (h < 1) {
    h = 0;
  }
  uVar5 = 0;
  for (iVar6 = 0; uVar7 = uVar4, uVar3 = uVar5, uVar1 = uVar2, iVar6 != h; iVar6 = iVar6 + 1) {
    while( true ) {
      if (uVar7 == 0) break;
      dst[uVar3] = src[uVar1];
      uVar7 = uVar7 - 1;
      uVar3 = uVar3 + 1;
      uVar1 = uVar1 + 1;
    }
    uVar5 = uVar5 + dststride;
    uVar2 = uVar2 + srcstride;
  }
  return;
}

Assistant:

void
copyPal8(uint8 *dst, uint32 dststride, uint8 *src, uint32 srcstride, int32 w, int32 h)
{
	int32 x, y;
	for(y = 0; y < h; y++)
		for(x = 0; x < w; x++)
			dst[y*dststride + x] = src[y*srcstride + x];
}